

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall FIX::double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  if (0x1b < shift_amount) {
    __assert_fail("shift_amount < kBigitSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2d3,"void FIX::double_conversion::Bignum::BigitsShiftLeft(int)");
  }
  if (shift_amount < 0) {
    __assert_fail("shift_amount >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2d4,"void FIX::double_conversion::Bignum::BigitsShiftLeft(int)");
  }
  if (0 < this->used_digits_) {
    puVar3 = (this->bigits_).start_;
    lVar5 = 0;
    uVar7 = 0;
    do {
      if ((this->bigits_).length_ <= lVar5) goto LAB_00164e1c;
      uVar1 = puVar3[lVar5];
      bVar4 = 0x1c - (byte)shift_amount & 0x1f;
      uVar6 = uVar1 >> bVar4;
      puVar3[lVar5] = (uVar1 << ((byte)shift_amount & 0x1f)) + uVar7 & 0xfffffff;
      lVar5 = lVar5 + 1;
      iVar2 = this->used_digits_;
      uVar7 = uVar6;
    } while (lVar5 < iVar2);
    if (uVar1 >> bVar4 != 0) {
      if ((iVar2 < 0) || ((this->bigits_).length_ <= iVar2)) {
LAB_00164e1c:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xca,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      (this->bigits_).start_[iVar2] = uVar6;
      this->used_digits_ = this->used_digits_ + 1;
    }
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(int shift_amount) {
  ASSERT(shift_amount < kBigitSize);
  ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    Chunk new_carry = bigits_[i] >> (kBigitSize - shift_amount);
    bigits_[i] = ((bigits_[i] << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    bigits_[used_digits_] = carry;
    used_digits_++;
  }
}